

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *A)

{
  int64_t iVar1;
  complex<float> *pcVar2;
  char cVar3;
  
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZBaseMatrix_01654548;
  iVar1 = (A->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow =
       (A->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = iVar1;
  cVar3 = (A->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed =
       (A->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = cVar3;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01653fb8;
  pcVar2 = A->fGiven;
  this->fElem = A->fElem;
  this->fGiven = pcVar2;
  this->fSize = A->fSize;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,&A->fPivot);
  TPZVec<std::complex<float>_>::TPZVec(&this->fWork,&A->fWork);
  A->fElem = (complex<float> *)0x0;
  A->fGiven = (complex<float> *)0x0;
  A->fSize = 0;
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(TPZFMatrix<TVar> &&A)
    : TPZMatrix<TVar>(A), fElem(A.fElem),
      fGiven(A.fGiven),fSize(A.fSize),
      fPivot(A.fPivot), fWork(A.fWork)
{
    A.fElem=nullptr;
    A.fGiven=nullptr;
    A.fSize=0;
}